

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGMSHReadMesh.cpp
# Opt level: O1

void __thiscall
TPZGMSHReadMesh::ReadMesh3D
          (TPZGMSHReadMesh *this,char *meshfile,TPZStack<TPZGeoEl_*,_10> *elemlist,
          TPZStack<TPZGeoElSide,_10> *elembclist)

{
  long *plVar1;
  TPZGeoElSide *pTVar2;
  long lVar3;
  int iVar4;
  istream *piVar5;
  TPZGeoNode *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TPZGMSHReadMesh *this_01;
  long lVar7;
  int64_t nvert;
  int64_t index;
  int64_t nnodes;
  int64_t nmat;
  int64_t numelem;
  TPZVec<long> nos;
  TPZVec<long> nodes;
  TPZVec<double> coord;
  int64_t fgt1;
  int64_t fgt2;
  int64_t numb;
  int64_t number;
  ifstream mesh;
  TPZStack<long,_10> Indexes;
  char title [256];
  undefined1 auStack_478 [8];
  long local_470;
  TPZGMSHReadMesh *local_468;
  _func_int **local_460;
  undefined1 local_458 [8];
  int local_450;
  undefined4 uStack_44c;
  TPZStack<TPZGeoEl_*,_10> *local_448;
  undefined8 local_440;
  long local_438;
  TPZVec<long> local_430;
  TPZVec<long> local_410;
  TPZVec<double> local_3f0;
  long local_3d0;
  double local_3b0 [2];
  long alStack_3a0 [2];
  int aiStack_390 [50];
  long alStack_2c8 [36];
  undefined1 local_1a8 [112];
  char local_138 [264];
  TPZGeoEl *pTVar6;
  
  this_01 = (TPZGMSHReadMesh *)local_1a8;
  local_468 = this;
  local_448 = elemlist;
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)local_1a8);
  Resequence(this_01,(TPZStack<long,_10> *)local_1a8,meshfile);
  std::ifstream::ifstream(local_3b0,meshfile,_S_in);
  lVar7 = *(long *)((long)alStack_3a0 + *(long *)((long)local_3b0[0] + -0x18));
  std::__istream_extract((istream *)local_3b0,local_138,0x100);
  if ((((*(int *)((long)aiStack_390 + *(long *)((long)local_3b0[0] + -0x18)) == 0) &&
       (lVar7 - 0x101U < 0xffffffffffffff00)) &&
      (plVar1 = *(long **)((long)alStack_2c8 + *(long *)((long)local_3b0[0] + -0x18)),
      (ulong)plVar1[3] <= (ulong)plVar1[2])) &&
     (iVar4 = (**(code **)(*plVar1 + 0x48))(), iVar4 == -1)) {
    std::ios::clear((int)auStack_478 + (int)*(undefined8 *)((long)local_3b0[0] + -0x18) + 200);
  }
  std::istream::_M_extract<long>((long *)local_3b0);
  TPZAdmChunkVector<TPZGeoNode,_10>::Resize(&local_468->fGeoMesh->fNodeVec,local_450);
  TPZVec<double>::TPZVec(&local_3f0,3);
  if (0 < CONCAT44(uStack_44c,local_450)) {
    lVar7 = 0;
    do {
      std::istream::_M_extract<long>((long *)local_3b0);
      piVar5 = std::istream::_M_extract<double>(local_3b0);
      piVar5 = std::istream::_M_extract<double>((double *)piVar5);
      std::istream::_M_extract<double>((double *)piVar5);
      this_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                          (&(local_468->fGeoMesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,
                           lVar7);
      TPZGeoNode::Initialize(this_00,&local_3f0,local_468->fGeoMesh);
      lVar7 = lVar7 + 1;
    } while (lVar7 < CONCAT44(uStack_44c,local_450));
  }
  lVar7 = *(long *)((long)alStack_3a0 + *(long *)((long)local_3b0[0] + -0x18));
  std::__istream_extract((istream *)local_3b0,local_138,0x100);
  if (((*(int *)((long)aiStack_390 + *(long *)((long)local_3b0[0] + -0x18)) == 0) &&
      (lVar7 - 0x101U < 0xffffffffffffff00)) &&
     ((plVar1 = *(long **)((long)alStack_2c8 + *(long *)((long)local_3b0[0] + -0x18)),
      (ulong)plVar1[3] <= (ulong)plVar1[2] && (iVar4 = (**(code **)(*plVar1 + 0x48))(), iVar4 == -1)
      ))) {
    std::ios::clear((int)auStack_478 + (int)*(undefined8 *)((long)local_3b0[0] + -0x18) + 200);
  }
  lVar7 = *(long *)((long)alStack_3a0 + *(long *)((long)local_3b0[0] + -0x18));
  std::__istream_extract((istream *)local_3b0,local_138,0x100);
  if (((*(int *)((long)aiStack_390 + *(long *)((long)local_3b0[0] + -0x18)) == 0) &&
      (lVar7 - 0x101U < 0xffffffffffffff00)) &&
     ((plVar1 = *(long **)((long)alStack_2c8 + *(long *)((long)local_3b0[0] + -0x18)),
      (ulong)plVar1[3] <= (ulong)plVar1[2] && (iVar4 = (**(code **)(*plVar1 + 0x48))(), iVar4 == -1)
      ))) {
    std::ios::clear((int)auStack_478 + (int)*(undefined8 *)((long)local_3b0[0] + -0x18) + 200);
  }
  std::istream::_M_extract<long>((long *)local_3b0);
  local_460 = (_func_int **)&PTR__TPZVec_0183b5f0;
  local_410._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  local_410.fStore = (long *)0x0;
  local_410.fNElements = 0;
  local_410.fNAlloc = 0;
  TPZVec<long>::Resize(&local_410,3);
  TPZVec<long>::TPZVec(&local_430,8);
  if (0 < local_438) {
    do {
      piVar5 = std::istream::_M_extract<long>((long *)local_3b0);
      piVar5 = std::istream::_M_extract<long>((long *)piVar5);
      piVar5 = std::istream::_M_extract<long>((long *)piVar5);
      piVar5 = std::istream::_M_extract<long>((long *)piVar5);
      std::istream::_M_extract<long>((long *)piVar5);
      if (local_470 < 1) {
        lVar7 = 0;
      }
      else {
        lVar7 = 0;
        do {
          std::istream::_M_extract<long>((long *)local_3b0);
          lVar7 = lVar7 + 1;
        } while (lVar7 < local_470);
      }
      if (local_470 == 3) {
        lVar7 = 0;
        do {
          local_410.fStore[lVar7] = *(long *)(local_1a8._8_8_ + (local_430.fStore[lVar7] + -1) * 8);
          lVar7 = lVar7 + 1;
        } while (lVar7 < 3);
        TPZVec<long>::Resize(&local_410,3);
        iVar4 = (*(local_468->fGeoMesh->super_TPZSavable)._vptr_TPZSavable[0xc])
                          (local_468->fGeoMesh,2,&local_410,1,local_458,1);
        pTVar6 = (TPZGeoEl *)CONCAT44(extraout_var,iVar4);
        iVar4 = (int)local_440;
        (*(elembclist->super_TPZManVector<TPZGeoElSide,_10>).super_TPZVec<TPZGeoElSide>._vptr_TPZVec
          [3])(elembclist,
               (elembclist->super_TPZManVector<TPZGeoElSide,_10>).super_TPZVec<TPZGeoElSide>.
               fNElements + 1);
LAB_013cce8a:
        pTVar2 = (elembclist->super_TPZManVector<TPZGeoElSide,_10>).super_TPZVec<TPZGeoElSide>.
                 fStore;
        lVar3 = (elembclist->super_TPZManVector<TPZGeoElSide,_10>).super_TPZVec<TPZGeoElSide>.
                fNElements;
        pTVar2[lVar3 + -1].fGeoEl = pTVar6;
        pTVar2[lVar3 + -1].fSide = -iVar4;
      }
      else {
        if (local_3d0 != 4 && local_470 == 4) {
          TPZVec<long>::Resize(&local_410,4);
          if (local_470 < 1) {
            lVar7 = 0;
          }
          else {
            lVar7 = 0;
            do {
              local_410.fStore[lVar7] =
                   *(long *)(local_1a8._8_8_ + (local_430.fStore[lVar7] + -1) * 8);
              lVar7 = lVar7 + 1;
            } while (lVar7 < local_470);
          }
          iVar4 = (*(local_468->fGeoMesh->super_TPZSavable)._vptr_TPZSavable[0xc])
                            (local_468->fGeoMesh,3,&local_410,1,local_458,1);
          pTVar6 = (TPZGeoEl *)CONCAT44(extraout_var_00,iVar4);
          iVar4 = (int)local_440;
          (*(elembclist->super_TPZManVector<TPZGeoElSide,_10>).super_TPZVec<TPZGeoElSide>.
            _vptr_TPZVec[3])(elembclist,
                             (elembclist->super_TPZManVector<TPZGeoElSide,_10>).
                             super_TPZVec<TPZGeoElSide>.fNElements + 1);
          goto LAB_013cce8a;
        }
        if (local_3d0 == 4 && local_470 == 4) {
          TPZVec<long>::Resize(&local_410,4);
          if (local_470 < 1) {
            lVar7 = 0;
          }
          else {
            lVar7 = 0;
            do {
              local_410.fStore[lVar7] =
                   *(long *)(local_1a8._8_8_ + (local_430.fStore[lVar7] + -1) * 8);
              lVar7 = lVar7 + 1;
            } while (lVar7 < local_470);
          }
          iVar4 = (*(local_468->fGeoMesh->super_TPZSavable)._vptr_TPZSavable[0xc])
                            (local_468->fGeoMesh,4,&local_410,1,local_458,1);
          TPZStack<TPZGeoEl_*,_10>::Push(local_448,(TPZGeoEl *)CONCAT44(extraout_var_01,iVar4));
        }
        else if (local_470 == 8) {
          TPZVec<long>::Resize(&local_410,8);
          if (local_470 < 1) {
            lVar7 = 0;
          }
          else {
            lVar7 = 0;
            do {
              local_410.fStore[lVar7] =
                   *(long *)(local_1a8._8_8_ + (local_430.fStore[lVar7] + -1) * 8);
              lVar7 = lVar7 + 1;
            } while (lVar7 < local_470);
          }
          iVar4 = (*(local_468->fGeoMesh->super_TPZSavable)._vptr_TPZSavable[0xc])
                            (local_468->fGeoMesh,7,&local_410,1,local_458,1);
          TPZStack<TPZGeoEl_*,_10>::Push(local_448,(TPZGeoEl *)CONCAT44(extraout_var_02,iVar4));
        }
      }
    } while (lVar7 + 1 < local_438);
  }
  lVar7 = *(long *)((long)alStack_3a0 + *(long *)((long)local_3b0[0] + -0x18));
  std::__istream_extract((istream *)local_3b0,local_138,0x100);
  if ((((*(int *)((long)aiStack_390 + *(long *)((long)local_3b0[0] + -0x18)) == 0) &&
       (lVar7 - 0x101U < 0xffffffffffffff00)) &&
      (plVar1 = *(long **)((long)alStack_2c8 + *(long *)((long)local_3b0[0] + -0x18)),
      (ulong)plVar1[3] <= (ulong)plVar1[2])) &&
     (iVar4 = (**(code **)(*plVar1 + 0x48))(), iVar4 == -1)) {
    std::ios::clear((int)auStack_478 + (int)*(undefined8 *)((long)local_3b0[0] + -0x18) + 200);
  }
  std::ifstream::close();
  local_430._vptr_TPZVec = local_460;
  if (local_430.fStore != (long *)0x0) {
    operator_delete__(local_430.fStore);
  }
  local_410._vptr_TPZVec = local_460;
  if (local_410.fStore != (long *)0x0) {
    operator_delete__(local_410.fStore);
  }
  local_3f0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_3f0.fStore != (double *)0x0) {
    operator_delete__(local_3f0.fStore);
  }
  std::ifstream::~ifstream(local_3b0);
  TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)local_1a8);
  return;
}

Assistant:

void TPZGMSHReadMesh::ReadMesh3D(char *meshfile,TPZStack<TPZGeoEl *> &elemlist,TPZStack<TPZGeoElSide> &elembclist){
	
	//o GMSH pode não retornar os nós sequencialmente
	//nesse casso deveram ser resequenciados
	TPZStack<int64_t> Indexes;
	Resequence(Indexes,meshfile);
	std::ifstream mesh(meshfile);
	char title[256];
	int64_t nnodes,number;
	mesh >> title;//$NOD
	mesh >> nnodes;
	fGeoMesh->NodeVec().Resize(nnodes);   
	TPZVec<REAL> coord(3);
	int64_t i;
	for(i=0;i<nnodes;i++){
		mesh >> number;
		mesh >> coord[0] >> coord[1] >> coord[2];
		fGeoMesh->NodeVec()[i].Initialize(coord,*fGeoMesh);
	}
	mesh >> title;//$ENDNOD
	mesh >> title;//$ELM
	int64_t numelem;
	mesh >> numelem;
	TPZVec<int64_t> nodes;
	nodes.Resize(3);
	int64_t index;
	int64_t numb,fgt1,nmat,fgt2,nvert;
	TPZVec<int64_t> nos(8);//máximo do cubo
	for(i=0;i<numelem;i++){
		mesh >> numb >> fgt1 >> nmat >> fgt2 >> nvert;
		for(i=0;i<nvert;i++) mesh >> nos[i];
		if(nvert == 3){//triângulos
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			nodes.Resize(3);
			elembclist.Push(TPZGeoElSide(fGeoMesh->CreateGeoElement(ETriangle,nodes,1,index),-nmat));
			continue;
		} else if(nvert == 4 && fgt1 != 4){//quadrilateros
			nodes.Resize(4);
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			elembclist.Push(TPZGeoElSide(fGeoMesh->CreateGeoElement(EQuadrilateral,nodes,1,index),-nmat));
			continue;
		} else if(nvert == 4 && fgt1 == 4){//tetraedros
			nodes.Resize(4);
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			elemlist.Push(fGeoMesh->CreateGeoElement(ETetraedro,nodes,1,index));
			continue;
		} else if(nvert == 8){//hexaedros
			nodes.Resize(8);
			for(i=0;i<nvert;i++) nodes[i] = Indexes[nos[i]-1];//nos[i]-1;
			elemlist.Push(fGeoMesh->CreateGeoElement(ECube,nodes,1,index));
			continue;
		}
	}
	mesh >> title;//$ENDELM
	mesh.close();
}